

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

Type * __thiscall Typelib::Registry::build(Registry *this,string *name,size_t size)

{
  Type *pTVar1;
  string local_40;
  
  pTVar1 = get(this,name);
  if (pTVar1 == (Type *)0x0) {
    getFullName(&local_40,this,name);
    pTVar1 = TypeBuilder::build(this,&local_40,(int)size);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return pTVar1;
}

Assistant:

const Type* Registry::build(const std::string& name, std::size_t size)
    {
        const Type* type = get(name);
        if (type)
            return type;

        return TypeBuilder::build(*this, getFullName(name), size);
    }